

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O0

void swrenderer::R_3D_AddHeight(secplane_t *add,sector_t *sec)

{
  bool bVar1;
  double dVar2;
  HeightLevel *pHVar3;
  HeightLevel *pHVar4;
  double dVar5;
  double dVar6;
  TVector2<double> local_40;
  double local_30;
  double height;
  HeightLevel *curr;
  HeightLevel *near;
  sector_t *sec_local;
  secplane_t *add_local;
  
  near = (HeightLevel *)sec;
  sec_local = (sector_t *)add;
  TVector2<double>::TVector2(&local_40,&ViewPos);
  dVar5 = secplane_t::ZatPoint(add,&local_40);
  local_30 = dVar5;
  dVar6 = sector_t::CenterCeiling((sector_t *)near);
  dVar2 = local_30;
  if ((dVar5 < dVar6) && (dVar5 = sector_t::CenterFloor((sector_t *)near), dVar5 < dVar2)) {
    fakeActive = 1;
    if (height_max < 0) {
      height_top = (HeightLevel *)
                   M_Malloc_Dbg(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                                ,0x56);
      height_cur = height_top;
      height_top->height = local_30;
      height_top->prev = (HeightLevel *)0x0;
      height_top->next = (HeightLevel *)0x0;
    }
    else {
      curr = height_top;
      while( true ) {
        bVar1 = false;
        if (curr != (HeightLevel *)0x0) {
          bVar1 = curr->height < local_30;
        }
        if (!bVar1) break;
        curr = curr->next;
      }
      if (curr == (HeightLevel *)0x0) {
        pHVar4 = (HeightLevel *)
                 M_Malloc_Dbg(0x18,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                              ,0x4e);
        pHVar4->height = local_30;
        pHVar4->prev = height_cur;
        pHVar4->next = (HeightLevel *)0x0;
        height_cur->next = pHVar4;
        height_cur = pHVar4;
      }
      else {
        if ((curr->height == local_30) && (!NAN(curr->height) && !NAN(local_30))) {
          fakeActive = 1;
          return;
        }
        pHVar3 = (HeightLevel *)
                 M_Malloc_Dbg(0x18,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                              ,0x46);
        pHVar3->height = local_30;
        pHVar3->prev = curr->prev;
        pHVar3->next = curr;
        pHVar4 = pHVar3;
        if (curr->prev != (HeightLevel *)0x0) {
          curr->prev->next = pHVar3;
          pHVar4 = height_top;
        }
        height_top = pHVar4;
        curr->prev = pHVar3;
      }
    }
    height_max = height_max + 1;
  }
  return;
}

Assistant:

void R_3D_AddHeight(secplane_t *add, sector_t *sec)
{
	HeightLevel *near;
	HeightLevel *curr;

	double height = add->ZatPoint(ViewPos);
	if(height >= sec->CenterCeiling()) return;
	if(height <= sec->CenterFloor()) return;

	fakeActive = 1;

	if(height_max >= 0) {
		near = height_top;
		while(near && near->height < height) near = near->next;
		if(near) {
			if(near->height == height) return;
			curr = (HeightLevel*)M_Malloc(sizeof(HeightLevel));
			curr->height = height;
			curr->prev = near->prev;
			curr->next = near;
			if(near->prev) near->prev->next = curr;
			else height_top = curr;
			near->prev = curr;
		} else {
			curr = (HeightLevel*)M_Malloc(sizeof(HeightLevel));
			curr->height = height;
			curr->prev = height_cur;
			curr->next = NULL;
			height_cur->next = curr;
			height_cur = curr;
		}
	} else {
		height_top = height_cur = (HeightLevel*)M_Malloc(sizeof(HeightLevel));
		height_top->height = height;
		height_top->prev = NULL;
		height_top->next = NULL;
	}
	height_max++;
}